

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O0

_Bool bitset_container_empty(bitset_container_t *bitset)

{
  int i;
  bitset_container_t *bitset_local;
  _Bool local_1;
  
  if (bitset->cardinality == -1) {
    for (i = 0; i < 0x400; i = i + 1) {
      if (bitset->words[i] != 0) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = bitset->cardinality == 0;
  }
  return local_1;
}

Assistant:

static inline bool bitset_container_empty(const bitset_container_t *bitset) {
    if (bitset->cardinality == BITSET_UNKNOWN_CARDINALITY) {
        for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; i++) {
            if ((bitset->words[i]) != 0) return false;
        }
        return true;
    }
    return bitset->cardinality == 0;
}